

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Utf8ReadLimited(u8 *z,int n,u32 *piOut)

{
  bool bVar1;
  int i;
  u32 c;
  u32 *piOut_local;
  int n_local;
  u8 *z_local;
  
  i = 1;
  c = (u32)*z;
  if (0xbf < c) {
    c = (u32)""[c - 0xc0];
    n_local = n;
    if (4 < n) {
      n_local = 4;
    }
    while( true ) {
      bVar1 = false;
      if (i < n_local) {
        bVar1 = (z[i] & 0xc0) == 0x80;
      }
      if (!bVar1) break;
      c = c * 0x40 + (z[i] & 0x3f);
      i = i + 1;
    }
  }
  *piOut = c;
  return i;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8ReadLimited(
  const u8 *z,
  int n,
  u32 *piOut
){
  u32 c;
  int i = 1;
  assert( n>0 );
  c = z[0];
  if( c>=0xc0 ){
    c = sqlite3Utf8Trans1[c-0xc0];
    if( n>4 ) n = 4;
    while( i<n && (z[i] & 0xc0)==0x80 ){
      c = (c<<6) + (0x3f & z[i]);
      i++;
    }
  }
  *piOut = c;
  return i;
}